

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_WindingNumber::AddBoundary(ON_WindingNumber *this,ON_2dPoint p)

{
  double dVar1;
  ON__UINT32 OVar2;
  bool bVar3;
  ON__UINT32 boundary_segment_count0;
  ON_WindingNumber *this_local;
  ON_2dPoint p_local;
  
  p_local.x = p.y;
  this_local = (ON_WindingNumber *)p.x;
  OVar2 = this->m_boundary_segment_count;
  bVar3 = Internal_HaveWindingPoint(this);
  if (bVar3) {
    dVar1 = (this->m_prev_boundary_point).x;
    if ((dVar1 != (this->m_prev_boundary_point).x) ||
       (NAN(dVar1) || NAN((this->m_prev_boundary_point).x))) {
      (this->m_prev_boundary_point).x = (double)this_local;
      (this->m_prev_boundary_point).y = p_local.x;
    }
    else {
      Internal_AddBoundarySegment(this,&(this->m_prev_boundary_point).x,(double *)&this_local);
    }
  }
  return this->m_boundary_segment_count - OVar2;
}

Assistant:

ON__UINT32 ON_WindingNumber::AddBoundary(ON_2dPoint p)
{
  const ON__UINT32 boundary_segment_count0 = m_boundary_segment_count;
  if (Internal_HaveWindingPoint())
  {
    if ( m_prev_boundary_point.x == m_prev_boundary_point.x )
      Internal_AddBoundarySegment(&m_prev_boundary_point.x, &p.x);
    else 
      m_prev_boundary_point = p;
  }
  return (m_boundary_segment_count - boundary_segment_count0);
}